

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

CURLcode send_telnet_data(Curl_easy *data,char *buffer,ssize_t nread)

{
  CURLcode CVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  dynbuf *s;
  size_t bytes_written;
  pollfd pfd [1];
  size_t local_50;
  pollfd local_48;
  Curl_easy *local_40;
  connectdata *local_38;
  
  local_38 = data->conn;
  pvVar3 = memchr(buffer,0xff,nread);
  if (pvVar3 == (void *)0x0) {
    CVar1 = CURLE_OK;
  }
  else {
    s = &((data->req).p.telnet)->out;
    local_40 = data;
    Curl_dyn_reset(s);
    if (nread == 0) {
      CVar1 = CURLE_OK;
    }
    else {
      uVar4 = 0;
      do {
        CVar1 = Curl_dyn_addn(s,buffer + uVar4,1);
        if ((CVar1 == CURLE_OK) && (CVar1 = CURLE_OK, buffer[uVar4] == -1)) {
          CVar1 = Curl_dyn_addn(s,anon_var_dwarf_15aabf,1);
        }
        uVar4 = uVar4 + 1;
      } while ((uVar4 < (ulong)nread) && (CVar1 == CURLE_OK));
    }
    nread = Curl_dyn_len(s);
    buffer = (char *)Curl_dyn_uptr(s);
    data = local_40;
  }
  if (nread != 0 && CVar1 == CURLE_OK) {
    uVar4 = 0;
    do {
      local_48.fd = local_38->sock[0];
      local_48.events = 4;
      iVar2 = Curl_poll(&local_48,1,-1);
      CVar1 = CURLE_SEND_ERROR;
      if (1 < iVar2 + 1U) {
        local_50 = 0;
        CVar1 = Curl_xfer_send(data,(uchar *)buffer + uVar4,nread - uVar4,false,&local_50);
        uVar4 = uVar4 + local_50;
      }
    } while ((CVar1 == CURLE_OK) && (uVar4 < (ulong)nread));
  }
  return CVar1;
}

Assistant:

static CURLcode send_telnet_data(struct Curl_easy *data,
                                 char *buffer, ssize_t nread)
{
  size_t i, outlen;
  unsigned char *outbuf;
  CURLcode result = CURLE_OK;
  size_t bytes_written;
  size_t total_written = 0;
  struct connectdata *conn = data->conn;
  struct TELNET *tn = data->req.p.telnet;

  DEBUGASSERT(tn);
  DEBUGASSERT(nread > 0);
  if(nread < 0)
    return CURLE_TOO_LARGE;

  if(memchr(buffer, CURL_IAC, nread)) {
    /* only use the escape buffer when necessary */
    Curl_dyn_reset(&tn->out);

    for(i = 0; i < (size_t)nread && !result; i++) {
      result = Curl_dyn_addn(&tn->out, &buffer[i], 1);
      if(!result && ((unsigned char)buffer[i] == CURL_IAC))
        /* IAC is FF in hex */
        result = Curl_dyn_addn(&tn->out, "\xff", 1);
    }

    outlen = Curl_dyn_len(&tn->out);
    outbuf = Curl_dyn_uptr(&tn->out);
  }
  else {
    outlen = (size_t)nread;
    outbuf = (unsigned char *)buffer;
  }
  while(!result && total_written < outlen) {
    /* Make sure socket is writable to avoid EWOULDBLOCK condition */
    struct pollfd pfd[1];
    pfd[0].fd = conn->sock[FIRSTSOCKET];
    pfd[0].events = POLLOUT;
    switch(Curl_poll(pfd, 1, -1)) {
      case -1:                    /* error, abort writing */
      case 0:                     /* timeout (will never happen) */
        result = CURLE_SEND_ERROR;
        break;
      default:                    /* write! */
        bytes_written = 0;
        result = Curl_xfer_send(data, outbuf + total_written,
                                outlen - total_written, FALSE, &bytes_written);
        total_written += bytes_written;
        break;
    }
  }

  return result;
}